

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lpcolsetbase.h
# Opt level: O1

void __thiscall soplex::LPColSetBase<double>::clear(LPColSetBase<double> *this)

{
  SVSetBase<double>::clear(&this->super_SVSetBase<double>,-1);
  VectorBase<double>::reDim(&this->low,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->up,(this->super_SVSetBase<double>).set.thenum,true);
  VectorBase<double>::reDim(&this->object,(this->super_SVSetBase<double>).set.thenum,true);
  (this->scaleExp).thesize = 0;
  return;
}

Assistant:

void clear()
   {
      SVSetBase<R>::clear();
      low.reDim(num());
      up.reDim(num());
      object.reDim(num());
      scaleExp.clear();
   }